

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3FileData.h
# Opt level: O0

void Assimp::MD3::LatLngNormalToVec3(uint16_t p_iNormal,ai_real *p_afOut)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  ai_real invVal;
  ai_real lng;
  ai_real lat;
  ai_real *p_afOut_local;
  uint16_t p_iNormal_local;
  
  fVar1 = (float)((int)(uint)p_iNormal >> 8) * 0.024546297;
  fVar2 = (float)(p_iNormal & 0xff) * 0.024546297;
  dVar3 = std::cos((double)(ulong)(uint)fVar1);
  dVar4 = std::sin((double)(ulong)(uint)fVar2);
  *p_afOut = SUB84(dVar3,0) * SUB84(dVar4,0);
  dVar3 = std::sin((double)(ulong)(uint)fVar1);
  dVar4 = std::sin((double)(ulong)(uint)fVar2);
  p_afOut[1] = SUB84(dVar3,0) * SUB84(dVar4,0);
  dVar3 = std::cos((double)(ulong)(uint)fVar2);
  p_afOut[2] = SUB84(dVar3,0);
  return;
}

Assistant:

inline void LatLngNormalToVec3(uint16_t p_iNormal, ai_real* p_afOut)
{
    ai_real lat = (ai_real)(( p_iNormal >> 8u ) & 0xff);
    ai_real lng = (ai_real)(( p_iNormal & 0xff ));
    const ai_real invVal( ai_real( 1.0 ) / ai_real( 128.0 ) );
    lat *= ai_real( 3.141926 ) * invVal;
    lng *= ai_real( 3.141926 ) * invVal;

    p_afOut[ 0 ] = std::cos(lat) * std::sin(lng);
    p_afOut[ 1 ] = std::sin(lat) * std::sin(lng);
    p_afOut[ 2 ] = std::cos(lng);
}